

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void __thiscall
pbrt::BasicScene::AddInstanceUses(BasicScene *this,span<pbrt::InstanceSceneEntity> in)

{
  back_insert_iterator<std::vector<pbrt::InstanceSceneEntity,_std::allocator<pbrt::InstanceSceneEntity>_>_>
  __result;
  iterator __last;
  InstanceSceneEntity *in_RDI;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffff98;
  lock_guard<std::mutex> *in_stack_ffffffffffffffa0;
  
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  __result.container =
       (vector<pbrt::InstanceSceneEntity,_std::allocator<pbrt::InstanceSceneEntity>_> *)
       std::begin<pstd::span<pbrt::InstanceSceneEntity>>
                 ((span<pbrt::InstanceSceneEntity> *)0x51c5d8);
  __last = std::end<pstd::span<pbrt::InstanceSceneEntity>>
                     ((span<pbrt::InstanceSceneEntity> *)0x51c5e9);
  std::
  back_inserter<std::vector<pbrt::InstanceSceneEntity,std::allocator<pbrt::InstanceSceneEntity>>>
            ((vector<pbrt::InstanceSceneEntity,_std::allocator<pbrt::InstanceSceneEntity>_> *)
             in_stack_ffffffffffffff98);
  std::
  move<pbrt::InstanceSceneEntity*,std::back_insert_iterator<std::vector<pbrt::InstanceSceneEntity,std::allocator<pbrt::InstanceSceneEntity>>>>
            (in_RDI,__last,__result);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x51c63f);
  return;
}

Assistant:

void BasicScene::AddInstanceUses(pstd::span<InstanceSceneEntity> in) {
    std::lock_guard<std::mutex> lock(instanceUseMutex);
    std::move(std::begin(in), std::end(in), std::back_inserter(instances));
}